

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicResourceTexture::RunIteration
          (BasicResourceTexture *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  pointer *ppVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  int i;
  GLuint GVar7;
  GLint location;
  long lVar8;
  ostream *poVar9;
  ulong uVar10;
  void *pvVar11;
  int depth;
  bool *compile_error;
  bool bVar12;
  int width;
  int height;
  int i_1;
  uint uVar13;
  ulong uVar14;
  allocator_type local_221;
  GLuint *local_220;
  uvec3 global_size;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texture_data;
  float local_1c8 [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer_data;
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  global_size.m_data[2] = 0;
  global_size.m_data[0] = 0;
  global_size.m_data[1] = 0;
  lVar8 = 0;
  do {
    global_size.m_data[lVar8] = num_groups->m_data[lVar8] * param_1->m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer_data);
  ppVVar1 = &buffer_data.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppVVar1,"\nlayout(local_size_x = ",0x17);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)ppVVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_y = ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", local_size_z = ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             ");\nuniform sampler2D g_sampler0;\nuniform lowp sampler3D g_sampler1;\nuniform mediump sampler2DArray g_sampler2;\nlayout(std430) buffer OutputBuffer {\n  vec4 data0["
             ,0xa1);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data1[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"];\n  vec4 data2[",0x10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "];\n} g_out_buffer;\nvoid main() {\n  uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = texture(g_sampler0, vec2(gl_GlobalInvocationID) / vec2(kGlobalSize));\n  g_out_buffer.data1[global_index] = textureProj(g_sampler1, vec4(vec3(gl_GlobalInvocationID) / vec3(kGlobalSize), 1.0));\n  g_out_buffer.data2[global_index] = texelFetchOffset(g_sampler2, ivec3(gl_GlobalInvocationID), 0, ivec2(0));\n}"
             ,0x240);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer_data);
  std::ios_base::~ios_base(local_138);
  GVar7 = ComputeShaderBase::CreateComputeProgram
                    (&this->super_ComputeShaderBase,(string *)&texture_data);
  this->m_program = GVar7;
  if (texture_data.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&texture_data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(texture_data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(texture_data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar6 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  bVar12 = false;
  if (bVar6) {
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    uVar10 = 0;
    do {
      sprintf((char *)&buffer_data,"g_sampler%d",uVar10);
      location = glu::CallLogWrapper::glGetUniformLocation
                           (this_00,this->m_program,(GLchar *)&buffer_data);
      glu::CallLogWrapper::glUniform1i(this_00,location,(int)uVar10);
      uVar13 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar13;
    } while (uVar13 != 4);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    depth = num_groups->m_data[2] * param_1->m_data[2];
    uVar13 = height * width * depth;
    uVar10 = (ulong)uVar13;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&buffer_data,(ulong)(uVar13 * 4),(allocator_type *)&texture_data);
    local_220 = &this->m_storage_buffer;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,local_220);
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*local_220);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,uVar10 << 6,
               buffer_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    lVar8 = 0;
    do {
      global_size.m_data[lVar8] = 0x42f60000;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&texture_data,uVar10,(value_type *)&global_size,&local_221);
    if (this->m_texture[0] == 0) {
      glu::CallLogWrapper::glGenTextures(this_00,3,this->m_texture);
    }
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[0]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8814,width,height,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0x806f,this->m_texture[1]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x806f,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x806f,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c2);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture[2]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x8c1a,0,0x8814,width,height,depth,0,0x1908,0x1406,
               texture_data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_220);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar11 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,uVar10 * 0x30,1);
    if (uVar13 == 0) {
      bVar12 = true;
    }
    else {
      bVar12 = true;
      uVar14 = 0;
      uVar10 = 0;
      do {
        lVar8 = uVar14 * 0x10;
        fVar2 = *(float *)((long)pvVar11 + lVar8);
        fVar3 = *(float *)((long)pvVar11 + lVar8 + 4);
        fVar4 = *(float *)((long)pvVar11 + lVar8 + 8);
        fVar5 = *(float *)((long)pvVar11 + lVar8 + 0xc);
        lVar8 = 0;
        do {
          local_1c8[lVar8] = 123.0;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        if (((((fVar2 != local_1c8[0]) || (NAN(fVar2) || NAN(local_1c8[0]))) ||
             (fVar3 != local_1c8[1])) ||
            ((NAN(fVar3) || NAN(local_1c8[1]) || (fVar4 != local_1c8[2])))) ||
           (NAN(fVar4) || NAN(local_1c8[2]))) {
LAB_00c2415f:
          bVar12 = false;
          anon_unknown_0::Output("Incorrect data at index %d.\n",uVar10);
        }
        else if ((fVar5 != local_1c8[3]) || (NAN(fVar5) || NAN(local_1c8[3]))) goto LAB_00c2415f;
        uVar10 = (ulong)((int)uVar10 + 1);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13 * 3 + (uint)(uVar13 * 3 == 0));
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    if (texture_data.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(texture_data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)texture_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)texture_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (buffer_data.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(buffer_data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)buffer_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)buffer_data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar12;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		glUseProgram(m_program);
		for (int i = 0; i < 4; ++i)
		{
			char name[32];
			sprintf(name, "g_sampler%d", i);
			glUniform1i(glGetUniformLocation(m_program, name), i);
		}
		glUseProgram(0);

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();
		const GLint kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());

		std::vector<vec4> buffer_data(kBufferSize * 4);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 4, &buffer_data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		std::vector<vec4> texture_data(kBufferSize, vec4(123.0f));
		if (m_texture[0] == 0)
			glGenTextures(3, m_texture);

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kWidth, kHeight, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_3D, m_texture[1]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT, &texture_data[0]);

		glActiveTexture(GL_TEXTURE2);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture[2]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kWidth, kHeight, kDepth, 0, GL_RGBA, GL_FLOAT,
					 &texture_data[0]);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		vec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		data = static_cast<vec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * 3 * kBufferSize, GL_MAP_READ_BIT));
		bool ret = true;
		for (GLuint index = 0; index < kBufferSize * 3; ++index)
		{
			if (!IsEqual(data[index], vec4(123.0f)))
			{
				Output("Incorrect data at index %d.\n", index);
				ret = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return ret;
	}